

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O0

_Bool SASToken_Validate(STRING_HANDLE sasToken)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *expiryASCII_00;
  LOGGER_LOG p_Var6;
  time_t stopTime;
  double dVar7;
  double dVar8;
  size_t local_78;
  ulong local_70;
  double secSinceEpoch;
  double expiry;
  LOGGER_LOG l;
  size_t malloc_size;
  char *expiryASCII;
  int i;
  int tokenLength;
  int sigStop;
  int sigStart;
  int srStop;
  int srStart;
  int seStop;
  int seStart;
  char *sasTokenArray;
  _Bool result;
  STRING_HANDLE sasToken_local;
  
  pcVar4 = STRING_c_str(sasToken);
  if ((sasToken == (STRING_HANDLE)0x0) || (pcVar4 == (char *)0x0)) {
    sasTokenArray._7_1_ = false;
  }
  else {
    srStart = -1;
    srStop = -1;
    sigStart = -1;
    sigStop = -1;
    tokenLength = -1;
    i = -1;
    sVar5 = STRING_length(sasToken);
    iVar3 = (int)sVar5;
    for (expiryASCII._0_4_ = 0; (int)expiryASCII < iVar3; expiryASCII._0_4_ = (int)expiryASCII + 1)
    {
      if (((pcVar4[(int)expiryASCII] == 's') && (pcVar4[(int)expiryASCII + 1] == 'e')) &&
         (pcVar4[(int)expiryASCII + 2] == '=')) {
        srStart = (int)expiryASCII + 3;
        if ((sigStart < 1) || (-1 < sigStop)) {
          if ((0 < tokenLength) && (i < 0)) {
            if ((pcVar4[(int)expiryASCII + -1] == '&') || (pcVar4[(int)expiryASCII + -1] != ' ')) {
              if (pcVar4[(int)expiryASCII + -1] == '&') {
                i = (int)expiryASCII + -2;
              }
              else {
                srStart = -1;
              }
            }
            else {
              i = (int)expiryASCII + -1;
            }
          }
        }
        else if ((pcVar4[(int)expiryASCII + -1] == '&') || (pcVar4[(int)expiryASCII + -1] != ' ')) {
          if (pcVar4[(int)expiryASCII + -1] == '&') {
            sigStop = (int)expiryASCII + -2;
          }
          else {
            srStart = -1;
          }
        }
        else {
          sigStop = (int)expiryASCII + -1;
        }
      }
      else if (((pcVar4[(int)expiryASCII] == 's') && (pcVar4[(int)expiryASCII + 1] == 'r')) &&
              (pcVar4[(int)expiryASCII + 2] == '=')) {
        sigStart = (int)expiryASCII + 3;
        if ((srStart < 1) || (-1 < srStop)) {
          if ((0 < tokenLength) && (i < 0)) {
            if ((pcVar4[(int)expiryASCII + -1] == '&') || (pcVar4[(int)expiryASCII + -1] != ' ')) {
              if (pcVar4[(int)expiryASCII + -1] == '&') {
                i = (int)expiryASCII + -2;
              }
              else {
                sigStart = -1;
              }
            }
            else {
              i = (int)expiryASCII + -1;
            }
          }
        }
        else if ((pcVar4[(int)expiryASCII + -1] == '&') || (pcVar4[(int)expiryASCII + -1] != ' ')) {
          if (pcVar4[(int)expiryASCII + -1] == '&') {
            srStop = (int)expiryASCII + -2;
          }
          else {
            sigStart = -1;
          }
        }
        else {
          srStop = (int)expiryASCII + -1;
        }
      }
      else if (((pcVar4[(int)expiryASCII] == 's') && (pcVar4[(int)expiryASCII + 1] == 'i')) &&
              ((pcVar4[(int)expiryASCII + 2] == 'g' && (pcVar4[(int)expiryASCII + 3] == '=')))) {
        tokenLength = (int)expiryASCII + 4;
        if ((sigStart < 1) || (-1 < sigStop)) {
          if ((0 < srStart) && (srStop < 0)) {
            if ((pcVar4[(int)expiryASCII + -1] == '&') || (pcVar4[(int)expiryASCII + -1] != ' ')) {
              if (pcVar4[(int)expiryASCII + -1] == '&') {
                srStop = (int)expiryASCII + -2;
              }
              else {
                tokenLength = -1;
              }
            }
            else {
              srStop = (int)expiryASCII + -1;
            }
          }
        }
        else if ((pcVar4[(int)expiryASCII + -1] == '&') || (pcVar4[(int)expiryASCII + -1] != ' ')) {
          if (pcVar4[(int)expiryASCII + -1] == '&') {
            sigStop = (int)expiryASCII + -2;
          }
          else {
            tokenLength = -1;
          }
        }
        else {
          sigStop = (int)expiryASCII + -1;
        }
      }
    }
    if (((srStart < 0) || (sigStart < 0)) || (tokenLength < 0)) {
      sasTokenArray._7_1_ = false;
    }
    else {
      iVar1 = sigStop;
      iVar2 = iVar3;
      if (((-1 < srStop) && (iVar1 = iVar3, iVar2 = srStop, -1 < sigStop)) &&
         (iVar1 = sigStop, i < 0)) {
        i = iVar3;
      }
      srStop = iVar2;
      sigStop = iVar1;
      if (((srStart < srStop) && (sigStart < sigStop)) && (tokenLength < i)) {
        if ((uint)srStop < (uint)srStart) {
          local_70 = 0xffffffffffffffff;
        }
        else {
          local_70 = (long)srStop - (long)srStart;
        }
        if (local_70 < 0xfffffffffffffffe) {
          local_78 = local_70 + 1;
        }
        else {
          local_78 = 0xffffffffffffffff;
        }
        if ((local_78 == 0xffffffffffffffff) ||
           (expiryASCII_00 = (char *)malloc(local_78), expiryASCII_00 == (char *)0x0)) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/sastoken.c"
                      ,"SASToken_Validate",0xa3,1,"malloc error, size:%zu",local_78);
          }
          sasTokenArray._7_1_ = false;
        }
        else {
          memset(expiryASCII_00,0,((long)srStop - (long)srStart) + 1);
          for (expiryASCII._0_4_ = srStart;
              ((int)expiryASCII < srStop && (pcVar4[(int)expiryASCII] != '&'));
              expiryASCII._0_4_ = (int)expiryASCII + 1) {
            expiryASCII_00[(int)expiryASCII - srStart] = pcVar4[(int)expiryASCII];
          }
          dVar7 = getExpiryValue(expiryASCII_00);
          if (0.0 < dVar7) {
            stopTime = get_time((time_t *)0x0);
            dVar8 = get_difftime(stopTime,0);
            sasTokenArray._7_1_ = dVar8 <= dVar7;
          }
          else {
            sasTokenArray._7_1_ = false;
          }
          free(expiryASCII_00);
        }
      }
      else {
        sasTokenArray._7_1_ = false;
      }
    }
  }
  return sasTokenArray._7_1_;
}

Assistant:

bool SASToken_Validate(STRING_HANDLE sasToken)
{
    bool result;
    /*Codes_SRS_SASTOKEN_25_025: [**SASToken_Validate shall get the SASToken value by invoking STRING_c_str on the handle.**]***/
    const char* sasTokenArray = STRING_c_str(sasToken);

    /* Codes_SRS_SASTOKEN_25_024: [**If handle is NULL then SASToken_Validate shall return false.**] */
    /* Codes_SRS_SASTOKEN_25_026: [**If STRING_c_str on handle return NULL then SASToken_Validate shall return false.**] */
    if (sasToken == NULL || sasTokenArray == NULL)
    {
        result = false;
    }
    else
    {
        int seStart = -1, seStop = -1;
        int srStart = -1, srStop = -1;
        int sigStart = -1, sigStop = -1;
        int tokenLength = (int)STRING_length(sasToken);
        int i;
        for (i = 0; i < tokenLength; i++)
        {
            if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'e' && sasTokenArray[i + 2] == '=') // Look for se=
            {
                seStart = i + 3;
                if (srStart > 0 && srStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ') // look for either & or space
                        srStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        srStop = i - 2;
                    else
                        seStart = -1; // as the format is not either "&se=" or " se="
                }
                else if (sigStart > 0 && sigStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        sigStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        sigStop = i - 2;
                    else
                        seStart = -1;
                }
            }
            else if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'r' && sasTokenArray[i + 2] == '=') // Look for sr=
            {
                srStart = i + 3;
                if (seStart > 0 && seStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        seStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        seStop = i - 2;
                    else
                        srStart = -1;
                }
                else if (sigStart > 0 && sigStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        sigStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        sigStop = i - 2;
                    else
                        srStart = -1;
                }
            }
            else if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'i' && sasTokenArray[i + 2] == 'g' && sasTokenArray[i + 3] == '=') // Look for sig=
            {
                sigStart = i + 4;
                if (srStart > 0 && srStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        srStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        srStop = i - 2;
                    else
                        sigStart = -1;
                }
                else if (seStart > 0 && seStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        seStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        seStop = i - 2;
                    else
                        sigStart = -1;
                }
            }
        }

        /*Codes_SRS_SASTOKEN_25_027: [**If SASTOKEN does not obey the SASToken format then SASToken_Validate shall return false.**]***/
        /*Codes_SRS_SASTOKEN_25_028: [**SASToken_validate shall check for the presence of sr, se and sig from the token and return false if not found**]***/
        if (seStart < 0 || srStart < 0 || sigStart < 0)
        {
            result = false;
        }
        else
        {
            if (seStop < 0)
            {
                seStop = tokenLength;
            }
            else if (srStop < 0)
            {
                srStop = tokenLength;
            }
            else if (sigStop < 0)
            {
                sigStop = tokenLength;
            }

            if ((seStop <= seStart) ||
                (srStop <= srStart) ||
                (sigStop <= sigStart))
            {
                result = false;
            }
            else
            {
                char* expiryASCII;
                size_t malloc_size = safe_subtract_size_t((size_t)seStop, (size_t)seStart);
                malloc_size = safe_add_size_t(malloc_size, 1);
                /*Codes_SRS_SASTOKEN_25_031: [**If malloc fails during validation then SASToken_Validate shall return false.**]***/
                if (malloc_size == SIZE_MAX ||
                    (expiryASCII = (char*)malloc(malloc_size)) == NULL)
                {
                    LogError("malloc error, size:%zu", malloc_size);
                    result = false;
                }
                else
                {
                    double expiry;
                    // Add the Null terminator here
                    memset(expiryASCII, 0, (size_t)seStop - (size_t)seStart + 1);
                    for (i = seStart; i < seStop; i++)
                    {
                        // The se contains the expiration values, if a & token is encountered then
                        // the se field is complete.
                        if (sasTokenArray[i] == '&')
                        {
                            break;
                        }
                        expiryASCII[i - seStart] = sasTokenArray[i];
                    }
                    expiry = getExpiryValue(expiryASCII);
                    /*Codes_SRS_SASTOKEN_25_029: [**SASToken_validate shall check for expiry time from token and if token has expired then would return false **]***/
                    if (expiry <= 0)
                    {
                        result = false;
                    }
                    else
                    {
                        double secSinceEpoch = get_difftime(get_time(NULL), (time_t)0);
                        if (expiry < secSinceEpoch)
                        {
                            /*Codes_SRS_SASTOKEN_25_029: [**SASToken_validate shall check for expiry time from token and if token has expired then would return false **]***/
                            result = false;
                        }
                        else
                        {
                            /*Codes_SRS_SASTOKEN_25_030: [**SASToken_validate shall return true only if the format is obeyed and the token has not yet expired **]***/
                            result = true;
                        }
                    }
                    free(expiryASCII);
                }
            }
        }
    }

    return result;
}